

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# labels_solver.h
# Opt level: O1

uint RemSP::MemMerge(uint i,uint j)

{
  uint uVar1;
  int iVar2;
  pointer puVar3;
  pointer piVar4;
  int *piVar5;
  int *piVar6;
  uint *puVar7;
  uint *puVar8;
  uint *puVar9;
  uint *puVar10;
  int *piVar11;
  int *piVar12;
  
  piVar4 = mem_P_.accesses_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  puVar3 = mem_P_.vec_.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_start;
  piVar5 = mem_P_.accesses_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start + (int)i;
  *piVar5 = *piVar5 + 1;
  puVar7 = puVar3 + (int)i;
  uVar1 = *puVar7;
  piVar4[(int)j] = piVar4[(int)j] + 1;
  if (uVar1 != puVar3[(int)j]) {
    piVar11 = piVar4 + (int)j;
    puVar9 = puVar3 + (int)j;
    do {
      *piVar5 = *piVar5 + 1;
      uVar1 = *puVar7;
      iVar2 = *piVar11;
      *piVar11 = iVar2 + 1;
      if (*puVar9 < uVar1) {
        iVar2 = *piVar5;
        *piVar5 = iVar2 + 1;
        piVar6 = piVar11;
        puVar8 = puVar9;
        puVar10 = puVar7;
        piVar12 = piVar5;
        if (i == *puVar7) {
LAB_0011f0fa:
          *piVar6 = *piVar6 + 1;
          uVar1 = *puVar8;
          *piVar12 = *piVar12 + 1;
          *puVar10 = uVar1;
          break;
        }
        *piVar5 = iVar2 + 2;
        i = *puVar7;
        piVar6 = piVar5;
        puVar8 = puVar7;
        puVar7 = puVar9;
        piVar5 = piVar11;
      }
      else {
        *piVar11 = iVar2 + 2;
        piVar6 = piVar5;
        puVar8 = puVar7;
        puVar10 = puVar9;
        piVar12 = piVar11;
        if (j == *puVar9) goto LAB_0011f0fa;
        *piVar11 = iVar2 + 3;
        j = *puVar9;
        piVar6 = piVar11;
        puVar8 = puVar9;
      }
      *piVar5 = *piVar5 + 1;
      uVar1 = *puVar7;
      *piVar6 = *piVar6 + 1;
      *puVar8 = uVar1;
      piVar5 = piVar4 + (int)i;
      *piVar5 = *piVar5 + 1;
      puVar7 = puVar3 + (int)i;
      uVar1 = *puVar7;
      piVar11 = piVar4 + (int)j;
      *piVar11 = *piVar11 + 1;
      puVar9 = puVar3 + (int)j;
    } while (uVar1 != *puVar9);
  }
  *piVar5 = *piVar5 + 1;
  return *puVar7;
}

Assistant:

static unsigned MemMerge(unsigned i, unsigned j)
    {
        unsigned root_i(i), root_j(j);
        while (mem_P_[root_i] != mem_P_[root_j]) {
            if (mem_P_[root_i] > mem_P_[root_j]) {
                if (root_i == mem_P_[root_i]) {
                    mem_P_[root_i] = mem_P_[root_j];
                    return mem_P_[root_i];
                }
                unsigned z = mem_P_[root_i];
                mem_P_[root_i] = mem_P_[root_j];
                root_i = z;
            }
            else {
                if (root_j == mem_P_[root_j]) {
                    mem_P_[root_j] = mem_P_[root_i];
                    return mem_P_[root_i];
                }
                unsigned z = mem_P_[root_j];
                mem_P_[root_j] = mem_P_[root_i];
                root_j = z;
            }
        }
        return mem_P_[root_i];
    }